

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cArrayOfArraysTests.cpp
# Opt level: O2

void __thiscall
glcts::ArraysOfArrays::
ConstructorsAndUnsizedDeclConstructorSizing1<glcts::ArraysOfArrays::Interface::GL>::
test_shader_compilation
          (ConstructorsAndUnsizedDeclConstructorSizing1<glcts::ArraysOfArrays::Interface::GL> *this,
          TestShaderType tested_shader_type)

{
  _Base_ptr *__rhs;
  iterator iVar1;
  TestError *pTVar2;
  string shader_source;
  string variable_constructor;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_398;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_378;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_358;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_338;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_318;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_298;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_278;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_258;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_238;
  string valid_size_initializers [15];
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)valid_size_initializers,"[1][1][1][]",(allocator<char> *)&shader_source);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(valid_size_initializers + 1),"[1][1][][1]",
             (allocator<char> *)&variable_constructor);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(valid_size_initializers + 2),"[1][][1][1]",(allocator<char> *)&local_238);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(valid_size_initializers + 3),"[][1][1][1]",(allocator<char> *)&local_278);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(valid_size_initializers + 4),"[1][1][][]",(allocator<char> *)&local_298);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(valid_size_initializers + 5),"[1][][1][]",(allocator<char> *)&local_2b8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(valid_size_initializers + 6),"[][1][1][]",(allocator<char> *)&local_2d8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(valid_size_initializers + 7),"[1][][][1]",(allocator<char> *)&local_2f8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(valid_size_initializers + 8),"[][1][][1]",(allocator<char> *)&local_318);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(valid_size_initializers + 9),"[][][1][1]",(allocator<char> *)&local_338);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(valid_size_initializers + 10),"[1][][][]",(allocator<char> *)&local_358);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(valid_size_initializers + 0xb),"[][1][][]",(allocator<char> *)&local_378);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(valid_size_initializers + 0xc),"[][][1][]",(allocator<char> *)&local_398);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(valid_size_initializers + 0xd),"[][][][1]",(allocator<char> *)&local_3b8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(valid_size_initializers + 0xe),"[][][][]",(allocator<char> *)&local_258);
  iVar1 = std::
          _Rb_tree<glcts::test_var_type,_std::pair<const_glcts::test_var_type,_glcts::var_descriptor>,_std::_Select1st<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>,_std::less<glcts::test_var_type>,_std::allocator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>_>
          ::find((_Rb_tree<glcts::test_var_type,_std::pair<const_glcts::test_var_type,_glcts::var_descriptor>,_std::_Select1st<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>,_std::less<glcts::test_var_type>,_std::allocator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>_>
                  *)supported_variable_types_map,(key_type *)Interface::GL::var_types);
  if (iVar1._M_node == (_Base_ptr)(supported_variable_types_map + 8)) {
    pTVar2 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar2,"Type not found.",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
               ,0x92b);
    __cxa_throw(pTVar2,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  __rhs = &iVar1._M_node[1]._M_parent;
  shader_source._M_dataplus._M_p = (pointer)&shader_source.field_2;
  shader_source._M_string_length = 0;
  shader_source.field_2._M_local_buf[0] = '\0';
  std::operator+(&local_258,"    ",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__rhs);
  std::operator+(&local_3b8,&local_258," x");
  std::operator+(&local_398,&local_3b8,valid_size_initializers);
  std::operator+(&local_378,&local_398," = ");
  std::operator+(&local_358,&local_378,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__rhs);
  std::operator+(&local_338,&local_358,"[1][1][1][1](");
  std::operator+(&local_318,&local_338,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__rhs);
  std::operator+(&local_2f8,&local_318,"[1][1][1](");
  std::operator+(&local_2d8,&local_2f8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__rhs);
  std::operator+(&local_2b8,&local_2d8,"[1][1](");
  std::operator+(&local_298,&local_2b8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__rhs);
  std::operator+(&local_278,&local_298,"[1](");
  std::operator+(&local_238,&local_278,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &iVar1._M_node[4]._M_parent);
  std::operator+(&variable_constructor,&local_238,"))));\n");
  std::__cxx11::string::~string((string *)&local_238);
  std::__cxx11::string::~string((string *)&local_278);
  std::__cxx11::string::~string((string *)&local_298);
  std::__cxx11::string::~string((string *)&local_2b8);
  std::__cxx11::string::~string((string *)&local_2d8);
  std::__cxx11::string::~string((string *)&local_2f8);
  std::__cxx11::string::~string((string *)&local_318);
  std::__cxx11::string::~string((string *)&local_338);
  std::__cxx11::string::~string((string *)&local_358);
  std::__cxx11::string::~string((string *)&local_378);
  std::__cxx11::string::~string((string *)&local_398);
  std::__cxx11::string::~string((string *)&local_3b8);
  std::__cxx11::string::~string((string *)&local_258);
  std::__cxx11::string::_M_assign((string *)&shader_source);
  std::__cxx11::string::append((string *)&shader_source);
  if (tested_shader_type < SHADER_TYPE_LAST) {
    switch((ulong)tested_shader_type) {
    case 1:
      std::__cxx11::string::append((char *)&shader_source);
      break;
    case 4:
    case 3:
      std::__cxx11::string::append((string *)&shader_source);
    }
    std::__cxx11::string::append((string *)&shader_source);
    (*(code *)(&DAT_0171c29c + *(int *)(&DAT_0171c29c + (ulong)tested_shader_type * 4)))
              (&DAT_0171c29c + *(int *)(&DAT_0171c29c + (ulong)tested_shader_type * 4),
               empty_string_abi_cxx11_,empty_string_abi_cxx11_,empty_string_abi_cxx11_,
               empty_string_abi_cxx11_,empty_string_abi_cxx11_);
    return;
  }
  pTVar2 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (pTVar2,"Unrecognized shader type.",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
             ,0x923);
  __cxa_throw(pTVar2,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void ConstructorsAndUnsizedDeclConstructorSizing1<API>::test_shader_compilation(
	typename TestCaseBase<API>::TestShaderType tested_shader_type)
{
	std::string valid_size_initializers[] = { "[1][1][1][]", "[1][1][][1]", "[1][][1][1]", "[][1][1][1]", "[1][1][][]",
											  "[1][][1][]",  "[][1][1][]",  "[1][][][1]",  "[][1][][1]",  "[][][1][1]",
											  "[1][][][]",   "[][1][][]",   "[][][1][]",   "[][][][1]",   "[][][][]" };

	for (size_t var_type_index = 0; var_type_index < API::n_var_types; var_type_index++)
	{
		_supported_variable_types_map_const_iterator var_iterator =
			supported_variable_types_map.find(API::var_types[var_type_index]);

		if (var_iterator != supported_variable_types_map.end())
		{
			for (size_t valid_size_initializers_index = 0;
				 valid_size_initializers_index < sizeof(valid_size_initializers) / sizeof(valid_size_initializers[0]);
				 valid_size_initializers_index++)
			{
				std::string shader_source;
				std::string variable_constructor =
					"    " + var_iterator->second.type + " x" + valid_size_initializers[valid_size_initializers_index] +
					" = " + var_iterator->second.type + "[1][1][1][1](" + var_iterator->second.type + "[1][1][1](" +
					var_iterator->second.type + "[1][1](" + var_iterator->second.type + "[1](" +
					var_iterator->second.initializer_with_zeroes + "))));\n";

				shader_source = shader_start;
				shader_source += variable_constructor;

				/* End main */
				DEFAULT_MAIN_ENDING(tested_shader_type, shader_source);

				/* Execute test */
				EXECUTE_POSITIVE_TEST(tested_shader_type, shader_source, true, false);
			} /* for (int valid_size_initializers_index = 0; ...) */
		}	 /* if var_type iterator found */
		else
		{
			TCU_FAIL("Type not found.");
		}
	} /* for (int var_type_index = 0; ...) */
}